

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gradient.h
# Opt level: O0

GradientPoint * GradientPoint::fromRGB(float u,float r,float g,float b)

{
  GradientPoint *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  __type _Var2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  GradientPoint *out;
  float d;
  float max;
  float min;
  float local_34;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  
  GradientPoint(in_RDI);
  in_RDI->units = in_XMM0_Da;
  if (((1.0 < in_XMM1_Da) || (1.0 < in_XMM2_Da)) ||
     (local_10 = in_XMM3_Da, local_c = in_XMM2_Da, local_8 = in_XMM1_Da, 1.0 < in_XMM3_Da)) {
    local_8 = in_XMM1_Da / 255.0;
    local_c = in_XMM2_Da / 255.0;
    local_10 = in_XMM3_Da / 255.0;
  }
  in_RDI->rgb[0] = local_8;
  in_RDI->rgb[1] = local_c;
  in_RDI->rgb[2] = local_10;
  if ((local_c < local_8) || (local_10 < local_8)) {
    if ((local_8 < local_c) || (local_10 < local_c)) {
      local_14 = local_10;
    }
    else {
      local_14 = local_c;
    }
  }
  else {
    local_14 = local_8;
  }
  if ((local_8 < local_c) || (local_8 < local_10)) {
    if ((local_c < local_8) || (local_c < local_10)) {
      local_18 = local_10;
    }
    else {
      local_18 = local_c;
    }
  }
  else {
    local_18 = local_8;
  }
  in_RDI->hsv[2] = local_18;
  fVar1 = local_18 - local_14;
  if (0.0 < local_18) {
    local_34 = fVar1 / local_18;
  }
  else {
    local_34 = 0.0;
  }
  in_RDI->hsv[1] = local_34;
  if ((local_14 != local_18) || (NAN(local_14) || NAN(local_18))) {
    if ((local_18 != local_8) || (NAN(local_18) || NAN(local_8))) {
      if ((local_18 != local_c) || (NAN(local_18) || NAN(local_c))) {
        if ((local_18 == local_10) && (!NAN(local_18) && !NAN(local_10))) {
          in_RDI->hsv[0] = (local_8 - local_c) / fVar1 + 4.0;
        }
      }
      else {
        in_RDI->hsv[0] = (local_10 - local_8) / fVar1 + 2.0;
      }
    }
    else {
      _Var2 = std::fmod<float,int>(0.0,0x2398e5);
      in_RDI->hsv[0] = (float)_Var2;
    }
  }
  else {
    in_RDI->hsv[0] = 0.0;
  }
  in_RDI->hsv[0] = in_RDI->hsv[0] / 6.0;
  return in_RDI;
}

Assistant:

static const GradientPoint fromRGB(float u, float r, float g, float b) {
    float min, max;
    GradientPoint out;
    out.units = u;

    // Rescale if max input range exceeds 1
    if (r > 1 || g > 1 || b > 1) {
      r /= 255;
      g /= 255;
      b /= 255;
    }

    out.rgb[0] = r;
    out.rgb[1] = g;
    out.rgb[2] = b;

    // Compute min/max RGB
    if (r <= g && r <= b) min = r;
    else if (g <= r && g <= b) min = g;
    else min = b;

    if (r >= g && r >= b) max = r;
    else if (g >= r && g >= b) max = g;
    else max = b;

    // Perform RGB->HSV conversion
    out.hsv[2] = max;
    float d = max - min;
    out.hsv[1] = (max <= 0) ? 0 : d / max;

    if (min == max) out.hsv[0] = 0;
    else {
      if (max == r) out.hsv[0] = fmod((g - b) / d, 6);
      else if (max == g) out.hsv[0] = (b - r) / d + 2;
      else if (max == b) out.hsv[0] = (r - g) / d + 4;
    }

    out.hsv[0] /= 6;
    return out;
  }